

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# despacer.c
# Opt level: O0

size_t sse4_despace_branchless_u2(char *bytes,size_t howmany)

{
  char cVar1;
  undefined1 auVar2 [16];
  __m128i carriage_00;
  __m128i carriage_01;
  long lVar3;
  ulong in_RCX;
  longlong in_RDX;
  size_t sVar4;
  longlong in_R8;
  longlong in_R9;
  longlong lVar5;
  int *mask16_00;
  longlong lVar6;
  undefined8 uVar7;
  __m128i x_00;
  __m128i x_01;
  __m128i x_02;
  __m128i spaces_00;
  __m128i spaces_01;
  __m128i spaces_02;
  __m128i newline_00;
  __m128i newline_01;
  __m128i newline_02;
  __m128i alVar8;
  undefined8 in_stack_fffffffffffffe58;
  undefined1 uVar9;
  undefined1 uVar10;
  undefined1 uVar11;
  undefined1 in_stack_fffffffffffffe63;
  undefined4 in_stack_fffffffffffffe64;
  char c;
  int *piStack_198;
  int mask16_1;
  __m128i x;
  undefined4 local_17c;
  undefined8 uStack_178;
  int mask16;
  __m128i x2;
  __m128i x1;
  ulong local_150;
  size_t i;
  __m128i carriage;
  __m128i newline;
  __m128i spaces;
  size_t local_110;
  size_t pos;
  size_t howmany_local;
  char *bytes_local;
  
  local_110 = 0;
  uVar9 = 0x20;
  auVar2 = vpinsrb_avx(ZEXT116(0x20),0x20,1);
  auVar2 = vpinsrb_avx(auVar2,0x20,2);
  auVar2 = vpinsrb_avx(auVar2,0x20,3);
  auVar2 = vpinsrb_avx(auVar2,0x20,4);
  auVar2 = vpinsrb_avx(auVar2,0x20,5);
  auVar2 = vpinsrb_avx(auVar2,0x20,6);
  auVar2 = vpinsrb_avx(auVar2,0x20,7);
  auVar2 = vpinsrb_avx(auVar2,0x20,8);
  auVar2 = vpinsrb_avx(auVar2,0x20,9);
  auVar2 = vpinsrb_avx(auVar2,0x20,10);
  auVar2 = vpinsrb_avx(auVar2,0x20,0xb);
  auVar2 = vpinsrb_avx(auVar2,0x20,0xc);
  auVar2 = vpinsrb_avx(auVar2,0x20,0xd);
  auVar2 = vpinsrb_avx(auVar2,0x20,0xe);
  vpinsrb_avx(auVar2,0x20,0xf);
  uVar10 = 10;
  auVar2 = vpinsrb_avx(ZEXT116(10),10,1);
  auVar2 = vpinsrb_avx(auVar2,10,2);
  auVar2 = vpinsrb_avx(auVar2,10,3);
  auVar2 = vpinsrb_avx(auVar2,10,4);
  auVar2 = vpinsrb_avx(auVar2,10,5);
  auVar2 = vpinsrb_avx(auVar2,10,6);
  auVar2 = vpinsrb_avx(auVar2,10,7);
  auVar2 = vpinsrb_avx(auVar2,10,8);
  auVar2 = vpinsrb_avx(auVar2,10,9);
  auVar2 = vpinsrb_avx(auVar2,10,10);
  auVar2 = vpinsrb_avx(auVar2,10,0xb);
  auVar2 = vpinsrb_avx(auVar2,10,0xc);
  auVar2 = vpinsrb_avx(auVar2,10,0xd);
  auVar2 = vpinsrb_avx(auVar2,10,0xe);
  vpinsrb_avx(auVar2,10,0xf);
  uVar11 = 0xd;
  auVar2 = vpinsrb_avx(ZEXT116(0xd),0xd,1);
  auVar2 = vpinsrb_avx(auVar2,0xd,2);
  auVar2 = vpinsrb_avx(auVar2,0xd,3);
  auVar2 = vpinsrb_avx(auVar2,0xd,4);
  auVar2 = vpinsrb_avx(auVar2,0xd,5);
  auVar2 = vpinsrb_avx(auVar2,0xd,6);
  auVar2 = vpinsrb_avx(auVar2,0xd,7);
  auVar2 = vpinsrb_avx(auVar2,0xd,8);
  auVar2 = vpinsrb_avx(auVar2,0xd,9);
  auVar2 = vpinsrb_avx(auVar2,0xd,10);
  auVar2 = vpinsrb_avx(auVar2,0xd,0xb);
  auVar2 = vpinsrb_avx(auVar2,0xd,0xc);
  auVar2 = vpinsrb_avx(auVar2,0xd,0xd);
  auVar2 = vpinsrb_avx(auVar2,0xd,0xe);
  vpinsrb_avx(auVar2,0xd,0xf);
  sVar4 = howmany;
  for (local_150 = 0; local_150 + 0x1f < howmany; local_150 = local_150 + 0x20) {
    lVar5 = *(longlong *)(bytes + local_150);
    lVar6 = *(longlong *)((long)(bytes + local_150) + 8);
    uStack_178 = *(undefined8 *)(bytes + local_150 + 0x10);
    x2[0] = *(longlong *)(bytes + local_150 + 0x18);
    alVar8[1]._0_1_ = uVar9;
    alVar8[0] = in_stack_fffffffffffffe58;
    alVar8[1]._1_1_ = uVar10;
    alVar8[1]._2_1_ = uVar11;
    alVar8[1]._3_1_ = in_stack_fffffffffffffe63;
    alVar8[1]._4_4_ = in_stack_fffffffffffffe64;
    x_00[1] = sVar4;
    x_00[0] = (longlong)&local_17c;
    spaces_00[1] = in_RCX;
    spaces_00[0] = in_RDX;
    newline_00[1] = in_R9;
    newline_00[0] = in_R8;
    x2[1] = lVar5;
    alVar8 = cleanm128(x_00,spaces_00,newline_00,alVar8,piStack_198);
    spaces_01[0] = alVar8[1];
    *(longlong *)(bytes + local_110) = lVar5;
    *(longlong *)((long)(bytes + local_110) + 8) = lVar6;
    spaces_01[1]._0_4_ = POPCOUNT(local_17c);
    lVar3 = (long)(0x10 - (int)spaces_01[1]) + local_110;
    carriage_00[1]._0_1_ = uVar9;
    carriage_00[0] = in_stack_fffffffffffffe58;
    carriage_00[1]._1_1_ = uVar10;
    carriage_00[1]._2_1_ = uVar11;
    carriage_00[1]._3_1_ = in_stack_fffffffffffffe63;
    carriage_00[1]._4_4_ = in_stack_fffffffffffffe64;
    x_01[1] = sVar4;
    x_01[0] = (longlong)&local_17c;
    spaces_01[1]._4_4_ = 0;
    newline_01[1] = in_R9;
    newline_01[0] = in_R8;
    x2[1] = lVar5;
    alVar8 = cleanm128(x_01,spaces_01,newline_01,carriage_00,piStack_198);
    in_RDX = alVar8[1];
    *(undefined8 *)(bytes + lVar3) = uStack_178;
    *(longlong *)(bytes + lVar3 + 8) = x2[0];
    in_RCX = (ulong)(uint)POPCOUNT(local_17c);
    local_110 = (0x10 - POPCOUNT(local_17c)) + lVar3;
  }
  for (; local_150 + 0xf < howmany; local_150 = local_150 + 0x10) {
    mask16_00 = *(int **)(bytes + local_150);
    uVar7 = *(undefined8 *)(bytes + local_150 + 8);
    carriage_01[1]._0_1_ = uVar9;
    carriage_01[0] = in_stack_fffffffffffffe58;
    carriage_01[1]._1_1_ = uVar10;
    carriage_01[1]._2_1_ = uVar11;
    carriage_01[1]._3_1_ = in_stack_fffffffffffffe63;
    carriage_01[1]._4_4_ = in_stack_fffffffffffffe64;
    x_02[1] = sVar4;
    x_02[0] = (longlong)&stack0xfffffffffffffe64;
    spaces_02[1] = in_RCX;
    spaces_02[0] = in_RDX;
    newline_02[1] = in_R9;
    newline_02[0] = in_R8;
    alVar8 = cleanm128(x_02,spaces_02,newline_02,carriage_01,mask16_00);
    in_RDX = alVar8[1];
    *(int **)(bytes + local_110) = mask16_00;
    *(undefined8 *)(bytes + local_110 + 8) = uVar7;
    in_RCX = (ulong)(uint)POPCOUNT(in_stack_fffffffffffffe64);
    local_110 = (long)(0x10 - POPCOUNT(in_stack_fffffffffffffe64)) + local_110;
  }
  for (; local_150 < howmany; local_150 = local_150 + 1) {
    cVar1 = bytes[local_150];
    if (((cVar1 != '\r') && (cVar1 != '\n')) && (cVar1 != ' ')) {
      bytes[local_110] = cVar1;
      local_110 = local_110 + 1;
    }
  }
  return local_110;
}

Assistant:

size_t sse4_despace_branchless_u2(char *bytes, size_t howmany) {
  size_t pos = 0;
  __m128i spaces = _mm_set1_epi8(' ');
  __m128i newline = _mm_set1_epi8('\n');
  __m128i carriage = _mm_set1_epi8('\r');
  size_t i = 0;
  for (; i + 32 - 1 < howmany; i += 32) {
    __m128i x1 = _mm_loadu_si128((const __m128i *)(bytes + i));
    __m128i x2 = _mm_loadu_si128((const __m128i *)(bytes + i + 16));
    int mask16;
    x1 = cleanm128(x1, spaces, newline, carriage, &mask16);
    _mm_storeu_si128((__m128i *)(bytes + pos), x1);
    pos += 16 - _mm_popcnt_u32(mask16);

    x2 = cleanm128(x2, spaces, newline, carriage, &mask16);
    _mm_storeu_si128((__m128i *)(bytes + pos), x2);
    pos += 16 - _mm_popcnt_u32(mask16);
  }
  for (; i + 16 - 1 < howmany; i += 16) {
    __m128i x = _mm_loadu_si128((const __m128i *)(bytes + i));
    int mask16;
    x = cleanm128(x, spaces, newline, carriage, &mask16);
    _mm_storeu_si128((__m128i *)(bytes + pos), x);
    pos += 16 - _mm_popcnt_u32(mask16);
  }
  for (; i < howmany; i++) {
    char c = bytes[i];
    if (c == '\r' || c == '\n' || c == ' ') {
      continue;
    }
    bytes[pos++] = c;
  }
  return pos;
}